

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<andres::UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>,int>
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
          *expression,allocator_type *allocator)

{
  allocator_type *this_00;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  CoordinateOrder *pCVar4;
  size_t *begin;
  size_t *end;
  CoordinateOrder *internalCoordinateOrder;
  UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
  *e;
  Geometry<std::allocator<unsigned_long>_> local_b0;
  allocator<unsigned_long> local_71;
  Geometry<std::allocator<unsigned_long>_> local_70;
  allocator<int> local_21;
  allocator_type *local_20;
  allocator_type *allocator_local;
  ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
  *expression_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  
  local_20 = allocator;
  allocator_local = (allocator_type *)expression;
  expression_local =
       (ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
        *)this;
  std::allocator<int>::allocator(&local_21);
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,&local_21);
  std::allocator<int>::~allocator(&local_21);
  std::allocator<int>::allocator((allocator<int> *)(this + 0x40),local_20);
  sVar2 = ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
          ::size((ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
                  *)allocator_local);
  piVar3 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),sVar2,(void *)0x0);
  *(int **)this = piVar3;
  sVar2 = ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
          ::dimension((ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
                       *)allocator_local);
  if (sVar2 == 0) {
    pCVar4 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
             ::coordinateOrder((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                                *)allocator_local);
    std::allocator<unsigned_long>::allocator<int>(&local_71,(allocator<int> *)(this + 0x40));
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_70,0,pCVar4,1,true,&local_71);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_70);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70);
    std::allocator<unsigned_long>::~allocator(&local_71);
  }
  else {
    begin = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
            ::shapeBegin((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                          *)allocator_local);
    end = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
          ::shapeEnd((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                      *)allocator_local);
    pCVar4 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
             ::coordinateOrder((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                                *)allocator_local);
    internalCoordinateOrder =
         UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
         ::coordinateOrder((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                            *)allocator_local);
    std::allocator<unsigned_long>::allocator<int>
              ((allocator<unsigned_long> *)((long)&e + 7),(allocator<int> *)(this + 0x40));
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_b0,begin,end,pCVar4,
               internalCoordinateOrder,(allocator<unsigned_long> *)((long)&e + 7));
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_b0);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_b0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&e + 7));
  }
  this_00 = allocator_local;
  sVar2 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
          ::dimension((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                       *)allocator_local);
  if (sVar2 == 0) {
    sVar2 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
            ::size((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                    *)this_00);
    marray_detail::Assert<bool>(sVar2 < 2);
    iVar1 = UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>
            ::operator()((UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>
                          *)this_00,0);
    **(int **)this = iVar1;
  }
  else {
    sVar2 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
            ::size((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                    *)this_00);
    marray_detail::Assert<bool>(sVar2 != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>,int>
              (this,this_00);
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}